

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

void helper_mvo(CPUS390XState_conflict *env,uint32_t l,uint64_t dest,uint64_t src)

{
  byte bVar1;
  byte bVar2;
  int mmu_idx;
  uint32_t uVar3;
  uint offset;
  uint uVar4;
  uintptr_t unaff_retaddr;
  S390Access local_80;
  S390Access local_58;
  ulong uVar5;
  
  mmu_idx = cpu_mmu_index(env,SUB41(l,0));
  uVar4 = l >> 4;
  uVar5 = (ulong)uVar4;
  offset = l & 0xf;
  access_prepare(&local_58,env,src,offset + 1,MMU_DATA_LOAD,mmu_idx,unaff_retaddr);
  access_prepare(&local_80,env,dest,uVar4 + 1,MMU_DATA_STORE,mmu_idx,unaff_retaddr);
  uVar3 = cpu_ldub_data_ra_s390x(env,uVar5 + dest,unaff_retaddr);
  bVar1 = access_get_byte(env,&local_58,offset,unaff_retaddr);
  access_set_byte(env,&local_80,uVar4,bVar1 << 4 | (byte)uVar3 & 0xf,unaff_retaddr);
  while (0 < (int)uVar5) {
    if ((int)offset < 1) {
      bVar2 = 0;
    }
    else {
      bVar2 = access_get_byte(env,&local_58,offset - 1,unaff_retaddr);
    }
    uVar4 = (int)uVar5 - 1;
    access_set_byte(env,&local_80,uVar4,bVar2 << 4 | bVar1 >> 4,unaff_retaddr);
    offset = offset - 1;
    bVar1 = bVar2;
    uVar5 = (ulong)uVar4;
  }
  return;
}

Assistant:

void HELPER(mvo)(CPUS390XState *env, uint32_t l, uint64_t dest, uint64_t src)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    /* MVO always processes one more byte than specified - maximum is 16 */
    const int len_dest = (l >> 4) + 1;
    const int len_src = (l & 0xf) + 1;
    uintptr_t ra = GETPC();
    uint8_t byte_dest, byte_src;
    S390Access srca, desta;
    int i, j;

    srca = access_prepare(env, src, len_src, MMU_DATA_LOAD, mmu_idx, ra);
    desta = access_prepare(env, dest, len_dest, MMU_DATA_STORE, mmu_idx, ra);

    /* Handle rightmost byte */
    byte_dest = cpu_ldub_data_ra(env, dest + len_dest - 1, ra);
    byte_src = access_get_byte(env, &srca, len_src - 1, ra);
    byte_dest = (byte_dest & 0x0f) | (byte_src << 4);
    access_set_byte(env, &desta, len_dest - 1, byte_dest, ra);

    /* Process remaining bytes from right to left */
    for (i = len_dest - 2, j = len_src - 2; i >= 0; i--, j--) {
        byte_dest = byte_src >> 4;
        if (j >= 0) {
            byte_src = access_get_byte(env, &srca, j, ra);
        } else {
            byte_src = 0;
        }
        byte_dest |= byte_src << 4;
        access_set_byte(env, &desta, i, byte_dest, ra);
    }
}